

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

void __thiscall HighsLp::unapplyMods(HighsLp *this)

{
  value_type vVar1;
  value_type vVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  long in_RDI;
  HighsInt iCol_3;
  HighsInt k_3;
  HighsInt num_upper_bound;
  vector<double,_std::allocator<double>_> *tightened_semi_variable_upper_bound_value;
  vector<int,_std::allocator<int>_> *tightened_semi_variable_upper_bound_index;
  HighsInt iCol_2;
  HighsInt k_2;
  HighsInt num_lower_bound;
  vector<double,_std::allocator<double>_> *relaxed_semi_variable_lower_value;
  vector<int,_std::allocator<int>_> *relaxed_semi_variable_lower_index;
  HighsInt iCol_1;
  HighsInt k_1;
  HighsInt num_inconsistent_semi;
  HighsInt iCol;
  HighsInt k;
  HighsInt num_non_semi;
  HighsLpMods *in_stack_ffffffffffffff70;
  int local_58;
  int local_38;
  int local_1c;
  int local_10;
  
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x260));
  for (local_10 = 0; local_10 < (int)sVar4; local_10 = local_10 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x260),(long)local_10);
    iVar3 = *pvVar5;
    pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                       ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x178),
                        (long)iVar3);
    if (*pvVar6 == kContinuous) {
      pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x178),
                          (long)iVar3);
      *pvVar6 = kSemiContinuous;
    }
    else {
      pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x178),
                          (long)iVar3);
      *pvVar6 = kSemiInteger;
    }
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x278));
  for (local_1c = 0; local_1c < (int)sVar4; local_1c = local_1c + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x278),(long)local_1c);
    iVar3 = *pvVar5;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x290),(long)local_1c);
    vVar1 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)iVar3);
    *pvVar7 = vVar1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a8),(long)local_1c);
    vVar1 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),(long)iVar3);
    *pvVar7 = vVar1;
    pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                       ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x2c0),
                        (long)local_1c);
    vVar2 = *pvVar6;
    pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                       ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x178),
                        (long)iVar3);
    *pvVar6 = vVar2;
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d8));
  for (local_38 = 0; local_38 < (int)sVar4; local_38 = local_38 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d8),(long)local_38);
    iVar3 = *pvVar5;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2f0),(long)local_38);
    vVar1 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)iVar3);
    *pvVar7 = vVar1;
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x308));
  for (local_58 = 0; local_58 < (int)sVar4; local_58 = local_58 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x308),(long)local_58);
    iVar3 = *pvVar5;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 800),(long)local_58);
    in_stack_ffffffffffffff70 = (HighsLpMods *)*pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),(long)iVar3);
    *pvVar7 = (value_type)in_stack_ffffffffffffff70;
  }
  HighsLpMods::clear(in_stack_ffffffffffffff70);
  return;
}

Assistant:

void HighsLp::unapplyMods() {
  // Restore any non-semi types
  const HighsInt num_non_semi = this->mods_.save_non_semi_variable_index.size();
  for (HighsInt k = 0; k < num_non_semi; k++) {
    HighsInt iCol = this->mods_.save_non_semi_variable_index[k];
    assert(this->integrality_[iCol] == HighsVarType::kContinuous ||
           this->integrality_[iCol] == HighsVarType::kInteger);
    if (this->integrality_[iCol] == HighsVarType::kContinuous) {
      this->integrality_[iCol] = HighsVarType::kSemiContinuous;
    } else {
      this->integrality_[iCol] = HighsVarType::kSemiInteger;
    }
  }
  // Restore any inconsistent semi variables
  const HighsInt num_inconsistent_semi =
      this->mods_.save_inconsistent_semi_variable_index.size();
  if (!num_inconsistent_semi) {
    assert(
        !this->mods_.save_inconsistent_semi_variable_lower_bound_value.size());
    assert(
        !this->mods_.save_inconsistent_semi_variable_upper_bound_value.size());
    assert(!this->mods_.save_inconsistent_semi_variable_type.size());
  }
  for (HighsInt k = 0; k < num_inconsistent_semi; k++) {
    HighsInt iCol = this->mods_.save_inconsistent_semi_variable_index[k];
    this->col_lower_[iCol] =
        this->mods_.save_inconsistent_semi_variable_lower_bound_value[k];
    this->col_upper_[iCol] =
        this->mods_.save_inconsistent_semi_variable_upper_bound_value[k];
    this->integrality_[iCol] =
        this->mods_.save_inconsistent_semi_variable_type[k];
  }
  // Restore any relaxed lower bounds
  std::vector<HighsInt>& relaxed_semi_variable_lower_index =
      this->mods_.save_relaxed_semi_variable_lower_bound_index;
  std::vector<double>& relaxed_semi_variable_lower_value =
      this->mods_.save_relaxed_semi_variable_lower_bound_value;
  const HighsInt num_lower_bound = relaxed_semi_variable_lower_index.size();
  if (!num_lower_bound) {
    assert(!relaxed_semi_variable_lower_value.size());
  }
  for (HighsInt k = 0; k < num_lower_bound; k++) {
    HighsInt iCol = relaxed_semi_variable_lower_index[k];
    assert(this->integrality_[iCol] == HighsVarType::kSemiContinuous ||
           this->integrality_[iCol] == HighsVarType::kSemiInteger);
    this->col_lower_[iCol] = relaxed_semi_variable_lower_value[k];
  }
  // Restore any tightened upper bounds
  std::vector<HighsInt>& tightened_semi_variable_upper_bound_index =
      this->mods_.save_tightened_semi_variable_upper_bound_index;
  std::vector<double>& tightened_semi_variable_upper_bound_value =
      this->mods_.save_tightened_semi_variable_upper_bound_value;
  const HighsInt num_upper_bound =
      tightened_semi_variable_upper_bound_index.size();
  if (!num_upper_bound) {
    assert(!tightened_semi_variable_upper_bound_value.size());
  }
  for (HighsInt k = 0; k < num_upper_bound; k++) {
    HighsInt iCol = tightened_semi_variable_upper_bound_index[k];
    assert(this->integrality_[iCol] == HighsVarType::kSemiContinuous ||
           this->integrality_[iCol] == HighsVarType::kSemiInteger);
    this->col_upper_[iCol] = tightened_semi_variable_upper_bound_value[k];
  }

  this->mods_.clear();
}